

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibTable.cpp
# Opt level: O0

int lib::table::Insert(State *state)

{
  bool bVar1;
  int iVar2;
  Table *this;
  size_t sVar3;
  StackAPI *this_00;
  State *in_RDI;
  int value;
  size_t index;
  Table *table;
  int params;
  StackAPI api;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  Table *in_stack_ffffffffffffffb0;
  StackAPI *in_stack_ffffffffffffffb8;
  int index_00;
  undefined4 in_stack_ffffffffffffffd8;
  State *in_stack_ffffffffffffffe0;
  Table *in_stack_ffffffffffffffe8;
  int local_4;
  
  luna::StackAPI::StackAPI((StackAPI *)&stack0xffffffffffffffe0,in_RDI);
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT>
                    (in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                     (ValueT)in_stack_ffffffffffffffb0);
  if (bVar1) {
    iVar2 = luna::StackAPI::GetStackSize((StackAPI *)in_stack_ffffffffffffffb0);
    this = luna::StackAPI::GetTable
                     (in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    sVar3 = luna::Table::ArraySize(in_stack_ffffffffffffffb0);
    this_00 = (StackAPI *)(sVar3 + 1);
    index_00 = 1;
    if (2 < iVar2) {
      bVar1 = GetNumber<unsigned_long>
                        (in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                         (unsigned_long *)
                         CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
      if (!bVar1) {
        return 0;
      }
      index_00 = 2;
    }
    luna::StackAPI::GetValue(this_00,index_00);
    luna::Table::InsertArrayValue
              (in_stack_ffffffffffffffe8,(size_t)in_stack_ffffffffffffffe0,
               (Value *)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
    luna::StackAPI::PushBool((StackAPI *)this,(bool)in_stack_ffffffffffffffaf);
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Insert(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(2, luna::ValueT_Table))
            return 0;

        auto params = api.GetStackSize();
        auto table = api.GetTable(0);
        auto index = table->ArraySize() + 1;
        int value = 1;

        if (params > 2)
        {
            if (!GetNumber(api, 1, index))
                return 0;

            value = 2;
        }

        api.PushBool(table->InsertArrayValue(index, *api.GetValue(value)));
        return 1;
    }